

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall vkt::shaderexecutor::Functions::ATan2::~ATan2(ATan2 *this)

{
  CFloatFunc2::~CFloatFunc2(&this->super_CFloatFunc2);
  operator_delete(this,0x30);
  return;
}

Assistant:

ATan2			(void) : CFloatFunc2 ("atan", deAtan2) {}